

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_regexp_Symbol_match(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue v_00;
  JSValue val_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue val_01;
  JSValue this_obj;
  JSValue val_02;
  JSValue this_obj_00;
  JSValue val_03;
  JSValue val_04;
  JSValue val_05;
  JSValue this_obj_01;
  JSValue s;
  JSValue s_00;
  JSValue obj;
  JSValue r;
  JSValue r_00;
  JSValue v_07;
  JSValue this_obj_02;
  JSValue this_obj_03;
  JSValue v_08;
  JSValue this_obj_04;
  JSValue obj_00;
  JSValue obj_01;
  JSValue obj_02;
  int iVar1;
  BOOL BVar2;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  JSValue JVar3;
  JSValue JVar4;
  int64_t nextIndex;
  int64_t thisIndex;
  JSString *p;
  int isEmpty;
  int fullUnicode;
  int n;
  int global;
  JSValue matchStr;
  JSValue result;
  JSValue S;
  JSValue A;
  JSValue rx;
  JSValue v;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 uVar5;
  JSAtom in_stack_fffffffffffffd1c;
  JSContext *in_stack_fffffffffffffd20;
  JSValueUnion in_stack_fffffffffffffd28;
  JSValueUnion in_stack_fffffffffffffd30;
  JSValueUnion in_stack_fffffffffffffd38;
  JSValueUnion idx;
  JSValueUnion JVar6;
  JSValueUnion ctx_00;
  undefined4 in_stack_fffffffffffffd50;
  uint in_stack_fffffffffffffd54;
  JSValueUnion in_stack_fffffffffffffd58;
  JSValueUnion in_stack_fffffffffffffd60;
  JSValueUnion in_stack_fffffffffffffd68;
  JSValueUnion in_stack_fffffffffffffd70;
  JSValueUnion JVar7;
  JSValueUnion in_stack_fffffffffffffd78;
  int64_t in_stack_fffffffffffffd80;
  JSContext *local_258;
  JSValueUnion local_250;
  int64_t local_248;
  JSValueUnion local_240;
  int64_t local_238;
  JSValueUnion local_210;
  int64_t local_208;
  JSValueUnion local_1f0;
  int64_t local_1e8;
  JSAtom JStack_1dc;
  uint uStack_1cc;
  int local_1a0;
  undefined4 local_198;
  JSAtom prop;
  JSContext *ctx_01;
  int64_t iVar8;
  JSValueUnion local_168;
  int64_t local_160;
  JSValueUnion local_120;
  int64_t local_118;
  BOOL throw_ref_error;
  JSValue local_f0;
  JSValueUnion JStack_e8;
  JSValueUnion local_60;
  JSValueUnion local_58;
  JSValueUnion local_30;
  JSValueUnion local_28;
  undefined4 uStack_c;
  
  JVar3.tag = in_RDX;
  JVar3.u.float64 = in_RSI.float64;
  iVar1 = JS_IsObject(JVar3);
  if (iVar1 == 0) {
    _local_120 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x172925);
  }
  else {
    JVar6.ptr = (void *)((ulong)uStack_1cc << 0x20);
    iVar8 = 3;
    ctx_01 = (JSContext *)0x3;
    JVar4.u._4_4_ = in_stack_fffffffffffffd1c;
    JVar4.u.int32 = in_stack_fffffffffffffd18;
    JVar4.tag = (int64_t)in_stack_fffffffffffffd20;
    JVar3 = JS_ToString((JSContext *)0x1729fb,JVar4);
    local_1f0 = JVar3.u;
    local_1e8 = JVar3.tag;
    iVar1 = JS_IsException(JVar3);
    if (iVar1 == 0) {
      obj_00.tag = local_1e8;
      obj_00.u.ptr = local_1f0.ptr;
      this_obj_02.tag = iVar8;
      this_obj_02.u.ptr = JVar6.ptr;
      ctx_00 = in_RDI;
      JS_GetPropertyInternal(ctx_01,obj_00,JStack_1dc,this_obj_02,throw_ref_error);
      val_04.u._4_4_ = in_stack_fffffffffffffd54;
      val_04.u.int32 = in_stack_fffffffffffffd50;
      val_04.tag = (int64_t)in_stack_fffffffffffffd58.ptr;
      iVar1 = JS_ToBoolFree((JSContext *)ctx_00.ptr,val_04);
      if (-1 < iVar1) {
        if (iVar1 == 0) {
          r.tag = in_stack_fffffffffffffd80;
          r.u.float64 = in_stack_fffffffffffffd78.float64;
          s.tag = (int64_t)in_stack_fffffffffffffd70.ptr;
          s.u.float64 = in_stack_fffffffffffffd68.float64;
          JVar3 = JS_RegExpExec((JSContext *)in_stack_fffffffffffffd60.ptr,r,s);
          local_210 = JVar3.u;
          local_168 = local_210;
          local_208 = JVar3.tag;
          local_160 = local_208;
LAB_001731b5:
          v_02.tag = (int64_t)in_stack_fffffffffffffd30.ptr;
          v_02.u.ptr = in_stack_fffffffffffffd28.ptr;
          JS_FreeValue(in_stack_fffffffffffffd20,v_02);
          v_03.tag = (int64_t)in_stack_fffffffffffffd30.ptr;
          v_03.u.ptr = in_stack_fffffffffffffd28.ptr;
          JS_FreeValue(in_stack_fffffffffffffd20,v_03);
          local_118 = local_160;
          local_120.float64 = local_168.float64;
          return _local_120;
        }
        obj_01.tag = local_1e8;
        obj_01.u.ptr = local_1f0.ptr;
        this_obj_03.tag = iVar8;
        this_obj_03.u.ptr = JVar6.ptr;
        JVar6 = in_RDI;
        JS_GetPropertyInternal(ctx_01,obj_01,JStack_1dc,this_obj_03,throw_ref_error);
        val_05.u._4_4_ = in_stack_fffffffffffffd54;
        val_05.u.int32 = in_stack_fffffffffffffd50;
        val_05.tag = (int64_t)in_stack_fffffffffffffd58.ptr;
        iVar1 = JS_ToBoolFree((JSContext *)ctx_00.ptr,val_05);
        if ((-1 < iVar1) &&
           (this_obj.tag = (int64_t)JVar6.ptr,
           this_obj.u.float64 = in_stack_fffffffffffffd38.float64,
           val.tag = (int64_t)in_stack_fffffffffffffd30.ptr,
           val.u.ptr = in_stack_fffffffffffffd28.ptr,
           iVar1 = JS_SetProperty(in_stack_fffffffffffffd20,this_obj,in_stack_fffffffffffffd1c,val),
           -1 < iVar1)) {
          JVar3 = JS_NewArray(in_stack_fffffffffffffd20);
          local_240 = JVar3.u;
          local_168 = local_240;
          local_238 = JVar3.tag;
          local_160 = local_238;
          iVar1 = JS_IsException(JVar3);
          if (iVar1 == 0) {
            local_1a0 = 0;
            do {
              do {
                v_00.tag = (int64_t)in_stack_fffffffffffffd30.ptr;
                v_00.u.ptr = in_stack_fffffffffffffd28.ptr;
                JS_FreeValue(in_stack_fffffffffffffd20,v_00);
                r_00.tag = in_stack_fffffffffffffd80;
                r_00.u.float64 = in_stack_fffffffffffffd78.float64;
                s_00.tag = (int64_t)in_stack_fffffffffffffd70.ptr;
                s_00.u.ptr = in_stack_fffffffffffffd68.ptr;
                JVar3 = JS_RegExpExec((JSContext *)in_stack_fffffffffffffd60.ptr,r_00,s_00);
                local_250 = JVar3.u;
                local_248 = JVar3.tag;
                iVar1 = JS_IsException(JVar3);
                if (iVar1 != 0) goto LAB_00173211;
                v_08.tag = local_248;
                v_08.u.float64 = local_250.float64;
                iVar1 = JS_IsNull(v_08);
                if (iVar1 != 0) {
                  if (local_1a0 == 0) {
                    v_01.tag = (int64_t)in_stack_fffffffffffffd30.ptr;
                    v_01.u.ptr = in_stack_fffffffffffffd28.ptr;
                    JS_FreeValue(in_stack_fffffffffffffd20,v_01);
                    local_168.ptr = (void *)((ulong)in_stack_fffffffffffffd54 << 0x20);
                    local_160 = 2;
                  }
                  goto LAB_001731b5;
                }
                obj.tag = (int64_t)in_stack_fffffffffffffd70.ptr;
                obj.u.ptr = in_stack_fffffffffffffd68.ptr;
                idx = in_RDI;
                JS_GetPropertyInt64((JSContext *)in_stack_fffffffffffffd60.ptr,obj,
                                    (int64_t)in_stack_fffffffffffffd58);
                val_01.tag = (int64_t)idx.ptr;
                val_01.u.ptr = in_stack_fffffffffffffd30.ptr;
                JVar3 = JS_ToStringFree((JSContext *)in_stack_fffffffffffffd28.ptr,val_01);
                local_198 = JVar3.u._0_4_;
                prop = JVar3.u._4_4_;
                local_258 = (JSContext *)JVar3.tag;
                iVar1 = JS_IsException(JVar3);
                if (iVar1 != 0) goto LAB_00173211;
                v_07.u._4_4_ = prop;
                v_07.u.int32 = local_198;
                v_07.tag = (int64_t)local_258;
                BVar2 = JS_IsEmptyString(v_07);
                local_1a0 = local_1a0 + 1;
                this_obj_01.tag = (int64_t)in_stack_fffffffffffffd60.ptr;
                this_obj_01.u.float64 = in_stack_fffffffffffffd58.float64;
                val_03.tag._0_4_ = in_stack_fffffffffffffd50;
                val_03.u.float64 = ctx_00.float64;
                val_03.tag._4_4_ = in_stack_fffffffffffffd54;
                iVar1 = JS_SetPropertyInt64((JSContext *)JVar6.ptr,this_obj_01,(int64_t)idx,val_03);
                if (iVar1 < 0) goto LAB_00173211;
              } while (BVar2 == 0);
              uVar5 = 0;
              obj_02.tag = local_1e8;
              obj_02.u.float64 = local_1f0.float64;
              this_obj_04.tag = local_248;
              this_obj_04.u.float64 = local_250.float64;
              in_stack_fffffffffffffd30 = in_RDI;
              JVar3 = JS_GetPropertyInternal(local_258,obj_02,prop,this_obj_04,throw_ref_error);
              JVar7 = JVar3.u;
              JStack_e8 = (JSValueUnion)JVar3.tag;
              val_02.tag = (int64_t)JVar6.ptr;
              val_02.u.ptr = idx.ptr;
              iVar1 = JS_ToLengthFree((JSContext *)in_stack_fffffffffffffd30.ptr,
                                      (int64_t *)in_stack_fffffffffffffd28.ptr,val_02);
              if (iVar1 < 0) break;
              in_stack_fffffffffffffd80 =
                   string_advance_index
                             ((JSString *)in_stack_fffffffffffffd20,
                              CONCAT44(in_stack_fffffffffffffd1c,uVar5),0);
              in_stack_fffffffffffffd28 = in_RDI;
              if (in_stack_fffffffffffffd80 == (int)in_stack_fffffffffffffd80) {
                local_30._4_4_ = uStack_c;
                local_30.int32 = (int)in_stack_fffffffffffffd80;
                local_28.float64 = 0.0;
              }
              else {
                JVar4 = __JS_NewFloat64((JSContext *)in_RDI.ptr,(double)in_stack_fffffffffffffd80);
                local_60 = JVar4.u;
                local_30 = local_60;
                local_58 = (JSValueUnion)JVar4.tag;
                local_28 = local_58;
              }
              this_obj_00.tag = (int64_t)JVar6.ptr;
              this_obj_00.u.ptr = idx.ptr;
              val_00.tag = (int64_t)in_stack_fffffffffffffd30.ptr;
              val_00.u.ptr = in_stack_fffffffffffffd28.ptr;
              iVar1 = JS_SetProperty(in_stack_fffffffffffffd20,this_obj_00,in_stack_fffffffffffffd1c
                                     ,val_00);
              in_stack_fffffffffffffd60 = local_30;
              in_stack_fffffffffffffd68 = local_28;
              in_stack_fffffffffffffd70 = JVar7;
              in_stack_fffffffffffffd78 = JStack_e8;
              local_f0 = JVar3;
            } while (-1 < iVar1);
          }
        }
      }
    }
LAB_00173211:
    v_04.tag = (int64_t)in_stack_fffffffffffffd30.ptr;
    v_04.u.ptr = in_stack_fffffffffffffd28.ptr;
    JS_FreeValue(in_stack_fffffffffffffd20,v_04);
    v_05.tag = (int64_t)in_stack_fffffffffffffd30.ptr;
    v_05.u.ptr = in_stack_fffffffffffffd28.ptr;
    JS_FreeValue(in_stack_fffffffffffffd20,v_05);
    v_06.tag = (int64_t)in_stack_fffffffffffffd30.ptr;
    v_06.u.ptr = in_stack_fffffffffffffd28.ptr;
    JS_FreeValue(in_stack_fffffffffffffd20,v_06);
    local_120.ptr = (void *)(local_120 << 0x20);
    local_118 = 6;
  }
  return _local_120;
}

Assistant:

static JSValue js_regexp_Symbol_match(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv)
{
    // [Symbol.match](str)
    JSValueConst rx = this_val;
    JSValue A, S, result, matchStr;
    int global, n, fullUnicode, isEmpty;
    JSString *p;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    A = JS_UNDEFINED;
    result = JS_UNDEFINED;
    matchStr = JS_UNDEFINED;
    S = JS_ToString(ctx, argv[0]);
    if (JS_IsException(S))
        goto exception;

    global = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_global));
    if (global < 0)
        goto exception;

    if (!global) {
        A = JS_RegExpExec(ctx, rx, S);
    } else {
        fullUnicode = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_unicode));
        if (fullUnicode < 0)
            goto exception;

        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0)) < 0)
            goto exception;
        A = JS_NewArray(ctx);
        if (JS_IsException(A))
            goto exception;
        n = 0;
        for(;;) {
            JS_FreeValue(ctx, result);
            result = JS_RegExpExec(ctx, rx, S);
            if (JS_IsException(result))
                goto exception;
            if (JS_IsNull(result))
                break;
            matchStr = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, result, 0));
            if (JS_IsException(matchStr))
                goto exception;
            isEmpty = JS_IsEmptyString(matchStr);
            if (JS_SetPropertyInt64(ctx, A, n++, matchStr) < 0)
                goto exception;
            if (isEmpty) {
                int64_t thisIndex, nextIndex;
                if (JS_ToLengthFree(ctx, &thisIndex,
                                    JS_GetProperty(ctx, rx, JS_ATOM_lastIndex)) < 0)
                    goto exception;
                p = JS_VALUE_GET_STRING(S);
                nextIndex = string_advance_index(p, thisIndex, fullUnicode);
                if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt64(ctx, nextIndex)) < 0)
                    goto exception;
            }
        }
        if (n == 0) {
            JS_FreeValue(ctx, A);
            A = JS_NULL;
        }
    }
    JS_FreeValue(ctx, result);
    JS_FreeValue(ctx, S);
    return A;

exception:
    JS_FreeValue(ctx, A);
    JS_FreeValue(ctx, result);
    JS_FreeValue(ctx, S);
    return JS_EXCEPTION;
}